

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.c++
# Opt level: O0

char * __thiscall kj::ExceptionImpl::what(ExceptionImpl *this)

{
  char *pcVar1;
  ExceptionImpl *in_RDX;
  String local_28;
  ExceptionImpl *local_10;
  ExceptionImpl *this_local;
  
  local_10 = this;
  str<kj::ExceptionImpl_const&>(&local_28,(kj *)this,in_RDX);
  String::operator=(&this->whatBuffer,&local_28);
  String::~String(&local_28);
  pcVar1 = String::begin(&this->whatBuffer);
  return pcVar1;
}

Assistant:

const char* ExceptionImpl::what() const noexcept {
  whatBuffer = str(*this);
  return whatBuffer.begin();
}